

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_2_5::anon_unknown_7::LineBufferTask::execute(LineBufferTask *this)

{
  int *piVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  char *pcVar5;
  long *plVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Semaphore *pSVar11;
  void *pvVar12;
  LineBuffer *pLVar13;
  Compression *pCVar14;
  Compressor *pCVar15;
  pointer ppLVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  Data *pDVar23;
  LineBuffer *pLVar24;
  long lVar25;
  long lVar26;
  ulong *puVar27;
  long lVar28;
  char *pcVar29;
  bool bVar30;
  char *writePtr;
  char *compPtr;
  uint local_54;
  char *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  
  pDVar23 = this->_ofd;
  pLVar13 = this->_lineBuffer;
  if (*(int *)&(pDVar23->bytesPerLine).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish == 0) {
    pSVar11 = &pLVar13->_sem;
    local_54 = *(int *)&pLVar13->field_0x6c + 1;
    local_44 = 1;
  }
  else {
    pSVar11 = (Semaphore *)&pLVar13->field_0x6c;
    local_54 = *(int *)&pLVar13->_sem - 1;
    local_44 = -1;
  }
  uVar20 = *(uint *)pSVar11;
  bytesPerDeepLineTable
            (&pDVar23->header,*(int *)&this->_lineBuffer->_sem,
             *(int *)&this->_lineBuffer->field_0x6c,*(char **)&pDVar23[1].header._map._M_t._M_impl,
             pDVar23[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color,
             *(int *)&pDVar23[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pDVar23->slices);
  pLVar13 = this->_lineBuffer;
  lVar21 = (long)*(int *)&pLVar13->_sem;
  if (*(int *)&pLVar13->_sem <= *(int *)&pLVar13->field_0x6c) {
    do {
      puVar27 = (ulong *)((pLVar13->buffer)._data +
                         (lVar21 - *(int *)((long)&(pLVar13->exception).field_2 + 8)) * 0x10);
      uVar18 = *(ulong *)((long)(this->_ofd->slices).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         (lVar21 - *(int *)((long)&(this->_ofd->bytesPerLine).
                                                                                                      
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4)) * 8);
      pvVar12 = operator_new__(uVar18);
      if ((void *)puVar27[1] != (void *)0x0) {
        operator_delete__((void *)puVar27[1]);
      }
      *puVar27 = uVar18;
      puVar27[1] = (ulong)pvVar12;
      pDVar23 = this->_ofd;
      iVar9 = *(int *)((long)&(pDVar23->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish + 4);
      if (iVar9 <= *(int *)&(pDVar23->bytesPerLine).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
        lVar26 = *(long *)&pDVar23[1].header._map._M_t._M_impl;
        p_Var3 = pDVar23[1].header._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        lVar28 = (long)iVar9;
        do {
          piVar1 = (int *)((long)p_Var3 +
                          (lVar21 - *(int *)((long)&(pDVar23->bytesPerLine).
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            + 4)) * 4);
          *piVar1 = *piVar1 + *(int *)((int)pDVar23[1].header._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_color * lVar28 +
                                      *(int *)&pDVar23[1].header._map._M_t._M_impl.
                                               super__Rb_tree_header._M_header.field_0x4 * lVar21 +
                                      lVar26);
          bVar30 = lVar28 < *(int *)&(pDVar23->bytesPerLine).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          lVar28 = lVar28 + 1;
        } while (bVar30);
      }
      pLVar13 = this->_lineBuffer;
      bVar30 = lVar21 < *(int *)&pLVar13->field_0x6c;
      lVar21 = lVar21 + 1;
    } while (bVar30);
  }
  for (; uVar20 != local_54; uVar20 = uVar20 + local_44) {
    local_50 = *(char **)((this->_lineBuffer->buffer)._data +
                         ((long)(int)uVar20 -
                         (long)*(int *)((long)&(this->_lineBuffer->exception).field_2 + 8)) * 0x10 +
                         8);
    pDVar23 = this->_ofd;
    ppLVar16 = (pDVar23->lineBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pDVar23->lineBuffers).
        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppLVar16) {
      uVar18 = 0;
      uVar17 = 1;
      do {
        pLVar13 = ppLVar16[uVar18];
        uVar2 = pLVar13->maxY;
        if ((int)uVar20 < 0) {
          if (-1 < (int)uVar2) {
            uVar8 = (uVar2 + ~uVar20) / uVar2;
            goto LAB_001634ee;
          }
          uVar8 = (~uVar2 - uVar20) / -uVar2;
        }
        else if ((int)uVar2 < 0) {
          uVar8 = uVar20 / -uVar2;
LAB_001634ee:
          uVar8 = -uVar8;
        }
        else {
          uVar8 = uVar20 / uVar2;
        }
        if (uVar20 == uVar8 * uVar2) {
          if ((char)pLVar13->scanLineMin == '\x01') {
            fillChannelWithZeroes
                      (&local_50,(Format)pDVar23->lineOffsetsPosition,
                       (PixelType)(pLVar13->buffer)._size,
                       (ulong)*(uint *)((long)pDVar23[1].header._map._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_left +
                                       ((long)(int)uVar20 -
                                       (long)*(int *)((long)&(pDVar23->bytesPerLine).
                                                                                                                          
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
          }
          else {
            copyFromDeepFrameBuffer
                      (&local_50,(pLVar13->buffer)._data,
                       *(char **)&pDVar23[1].header._map._M_t._M_impl,
                       (long)(int)pDVar23[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_color,
                       (long)*(int *)&pDVar23[1].header._map._M_t._M_impl.super__Rb_tree_header.
                                      _M_header.field_0x4,uVar20,
                       *(int *)((long)&(pDVar23->bytesPerLine).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4),
                       *(int *)&(pDVar23->bytesPerLine).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0,0,0,0,
                       (ptrdiff_t)pLVar13->dataPtr,*(ptrdiff_t *)&pLVar13->dataSize,
                       (ptrdiff_t)pLVar13->endOfLineBufferData,(Format)pDVar23->lineOffsetsPosition,
                       (PixelType)(pLVar13->buffer)._size);
          }
        }
        pDVar23 = this->_ofd;
        ppLVar16 = (pDVar23->lineBuffers).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        bVar30 = uVar17 < (ulong)((long)(pDVar23->lineBuffers).
                                        super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar16
                                 >> 3);
        uVar18 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar30);
    }
  }
  pLVar13 = this->_lineBuffer;
  iVar9 = *(int *)((long)&(pLVar13->exception).field_2 + 8);
  if (((int)uVar20 < iVar9) || (*(int *)((long)&(pLVar13->exception).field_2 + 0xc) < (int)uVar20))
  {
    iVar22 = *(int *)((long)&(pLVar13->exception).field_2 + 0xc);
    if (iVar22 < iVar9) {
      pcVar29 = (char *)0x0;
      uVar18 = 0;
    }
    else {
      puVar27 = (ulong *)(pLVar13->buffer)._data;
      uVar17 = (ulong)((iVar22 - iVar9) + 1);
      uVar18 = 0;
      pcVar29 = (char *)0x0;
      do {
        uVar4 = *puVar27;
        pcVar29 = pcVar29 + uVar4;
        if (uVar18 < uVar4) {
          uVar18 = uVar4;
        }
        puVar27 = puVar27 + 2;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    pvVar12 = operator_new__((ulong)pcVar29);
    if (*(void **)&pLVar13->dataSize != (void *)0x0) {
      operator_delete__(*(void **)&pLVar13->dataSize);
    }
    pLVar13->dataPtr = pcVar29;
    *(void **)&pLVar13->dataSize = pvVar12;
    pLVar13 = this->_lineBuffer;
    iVar9 = *(int *)((long)&(pLVar13->exception).field_2 + 8);
    if (iVar9 <= *(int *)((long)&(pLVar13->exception).field_2 + 0xc)) {
      lVar26 = -1;
      lVar28 = 0;
      lVar21 = 0;
      do {
        pcVar5 = (pLVar13->buffer)._data;
        memcpy((void *)(*(long *)&pLVar13->dataSize + (long)(int)lVar21),
               *(void **)(pcVar5 + lVar28 + 8),*(size_t *)(pcVar5 + lVar28));
        pLVar13 = this->_lineBuffer;
        lVar21 = (long)(int)lVar21 + *(long *)((pLVar13->buffer)._data + lVar28);
        iVar9 = *(int *)((long)&(pLVar13->exception).field_2 + 8);
        lVar26 = lVar26 + 1;
        lVar28 = lVar28 + 0x10;
      } while (lVar26 < (long)*(int *)((long)&(pLVar13->exception).field_2 + 0xc) - (long)iVar9);
    }
    pLVar13->endOfLineBufferData = *(char **)&pLVar13->dataSize;
    *(char **)&pLVar13->scanLineMin = pcVar29;
    *(char **)&pLVar13->minY = pcVar29;
    pLVar24 = this->_lineBuffer;
    if (*(int *)((long)&(pLVar24->exception).field_2 + 0xc) < iVar9) {
      uVar17 = 0;
    }
    else {
      lVar21._0_1_ = pLVar13->partiallyFull;
      lVar21._1_1_ = pLVar13->hasException;
      lVar21._2_6_ = *(undefined6 *)&pLVar13->field_0x42;
      uVar17 = 0;
      lVar26 = (long)iVar9;
      do {
        pDVar23 = this->_ofd;
        iVar9 = *(int *)((long)&(pDVar23->bytesPerLine).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 4);
        if (iVar9 <= *(int *)&(pDVar23->bytesPerLine).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
          iVar22 = 0;
          lVar28 = (long)iVar9;
          do {
            lVar19 = lVar21;
            iVar22 = iVar22 + *(int *)((int)pDVar23[1].header._map._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_color * lVar28 +
                                      *(int *)&pDVar23[1].header._map._M_t._M_impl.
                                               super__Rb_tree_header._M_header.field_0x4 * lVar26 +
                                      *(long *)&pDVar23[1].header._map._M_t._M_impl);
            local_50 = (char *)CONCAT44(local_50._4_4_,iVar22);
            lVar25 = 0;
            do {
              *(undefined1 *)(lVar19 + lVar25) = *(undefined1 *)((long)&local_50 + lVar25);
              lVar25 = lVar25 + 1;
            } while ((int)lVar25 != 4);
            uVar17 = uVar17 + 4;
            pDVar23 = this->_ofd;
            bVar30 = lVar28 < *(int *)&(pDVar23->bytesPerLine).
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            lVar28 = lVar28 + 1;
            lVar21 = lVar19 + lVar25;
          } while (bVar30);
          lVar21 = lVar19 + lVar25;
        }
        pLVar24 = this->_lineBuffer;
        bVar30 = lVar26 < *(int *)((long)&(pLVar24->exception).field_2 + 0xc);
        lVar26 = lVar26 + 1;
      } while (bVar30);
    }
    plVar6 = (long *)(pLVar24->exception).field_2._M_allocated_capacity;
    if (plVar6 != (long *)0x0) {
      uVar7._0_1_ = pLVar24->partiallyFull;
      uVar7._1_1_ = pLVar24->hasException;
      uVar7._2_6_ = *(undefined6 *)&pLVar24->field_0x42;
      iVar9 = (**(code **)(*plVar6 + 0x20))
                        (plVar6,uVar7,uVar17 & 0xffffffff,
                         *(undefined4 *)((long)&(pLVar24->exception).field_2 + 8),
                         &pLVar24->exception);
      (this->_lineBuffer->exception)._M_string_length = (long)iVar9;
    }
    pLVar13 = this->_lineBuffer;
    if (((pLVar13->exception).field_2._M_allocated_capacity == 0) ||
       (uVar17 <= (pLVar13->exception)._M_string_length)) {
      (pLVar13->exception)._M_string_length = uVar17;
      (pLVar13->exception)._M_dataplus._M_p = *(pointer *)&pLVar13->partiallyFull;
    }
    if (*(long **)&pLVar13->field_0x70 != (long *)0x0) {
      (**(code **)(**(long **)&pLVar13->field_0x70 + 8))();
    }
    pCVar14 = Header::compression(&this->_ofd->header);
    pCVar15 = newCompressor(*pCVar14,uVar18,&this->_ofd->header);
    pLVar13 = this->_lineBuffer;
    *(Compressor **)&pLVar13->field_0x70 = pCVar15;
    if (pCVar15 != (Compressor *)0x0) {
      iVar9 = (*pCVar15->_vptr_Compressor[4])
                        (pCVar15,pLVar13->endOfLineBufferData,(ulong)(uint)pLVar13->scanLineMin,
                         (ulong)*(uint *)((long)&(pLVar13->exception).field_2 + 8),&local_40);
      uVar17 = (ulong)iVar9;
      pLVar13 = this->_lineBuffer;
      uVar18._0_4_ = pLVar13->scanLineMin;
      uVar18._4_4_ = pLVar13->scanLineMax;
      if (uVar17 < uVar18) {
        pLVar13->scanLineMin = (int)uVar17;
        pLVar13->scanLineMax = (int)(uVar17 >> 0x20);
        pLVar13->endOfLineBufferData = local_40;
      }
      else {
        pDVar23 = this->_ofd;
        if ((int)pDVar23->lineOffsetsPosition == 0) {
          uVar20 = *(uint *)((long)&(pLVar13->exception).field_2 + 8);
          uVar2 = *(uint *)((long)&(pLVar13->exception).field_2 + 0xc);
          local_50 = *(char **)&pLVar13->dataSize;
          if ((int)uVar20 <= (int)uVar2) {
            do {
              local_38 = local_50;
              ppLVar16 = (pDVar23->lineBuffers).
                         super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              if ((pDVar23->lineBuffers).
                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish != ppLVar16) {
                uVar18 = 0;
                uVar17 = 1;
                do {
                  uVar8 = ppLVar16[uVar18]->maxY;
                  if ((int)uVar20 < 0) {
                    if (-1 < (int)uVar8) {
                      uVar10 = (uVar8 + ~uVar20) / uVar8;
                      goto LAB_001638a9;
                    }
                    uVar10 = (~uVar8 - uVar20) / -uVar8;
                  }
                  else if ((int)uVar8 < 0) {
                    uVar10 = uVar20 / -uVar8;
LAB_001638a9:
                    uVar10 = -uVar10;
                  }
                  else {
                    uVar10 = uVar20 / uVar8;
                  }
                  if (uVar20 == uVar10 * uVar8) {
                    convertInPlace(&local_50,&local_38,(PixelType)(ppLVar16[uVar18]->buffer)._size,
                                   (long)*(int *)((long)pDVar23[1].header._map._M_t._M_impl.
                                                        super__Rb_tree_header._M_header._M_left +
                                                 ((long)(int)uVar20 -
                                                 (long)*(int *)((long)&(pDVar23->bytesPerLine).
                                                                                                                                              
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4)) * 4));
                  }
                  ppLVar16 = (pDVar23->lineBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  bVar30 = uVar17 < (ulong)((long)(pDVar23->lineBuffers).
                                                  super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppLVar16 >> 3);
                  uVar18 = uVar17;
                  uVar17 = (ulong)((int)uVar17 + 1);
                } while (bVar30);
              }
              bVar30 = uVar20 != uVar2;
              uVar20 = uVar20 + 1;
            } while (bVar30);
          }
        }
      }
    }
    this->_lineBuffer->field_0x78 = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //
    
        if (_lineBuffer->uncompressedData == 0)
        {
            size_t uncompressedSize = 0;
            int maxY = min (_lineBuffer->maxY, _ifd->maxY);
    
            for (int i = _lineBuffer->minY - _ifd->minY;
                 i <= maxY - _ifd->minY;
		 ++i)
	    {
                uncompressedSize += _ifd->bytesPerLine[i];
	    }
    
            if (_lineBuffer->compressor &&
                static_cast<size_t>(_lineBuffer->dataSize) < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format();

                _lineBuffer->dataSize = _lineBuffer->compressor->uncompress
                    (_lineBuffer->buffer,
                     _lineBuffer->dataSize,
		     _lineBuffer->minY,
                     _lineBuffer->uncompressedData);
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //
    
                _lineBuffer->format = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;
            }
        }
        
        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop = _scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop = _scanLineMin - 1;
            dy = -1;
        }
    
        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //
    
            const char *readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];
    
            //
            // Iterate over all image channels.
            //
    
            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
		// (the scan line contains data only if y % ySampling == 0).
                //
    
                const InSliceInfo &slice = _ifd->slices[i];
    
                if (modp (y, slice.ySampling) != 0)
                    continue;
    
                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //
    
                int dMinX = divp (_ifd->minX, slice.xSampling);
                int dMaxX = divp (_ifd->maxX, slice.xSampling);
    
                //
		// Fill the frame buffer with pixel data.
                //
    
                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //
    
                    skipChannel (readPtr, slice.typeInFile, dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //
    
                    char *linePtr  = slice.base +
                                        intptr_t( divp (y, slice.ySampling) ) *
                                        intptr_t( slice.yStride );
    
                    char *writePtr = linePtr + intptr_t( dMinX ) * intptr_t( slice.xStride );
                    char *endPtr   = linePtr + intptr_t( dMaxX ) * intptr_t( slice.xStride );
                    
                    copyIntoFrameBuffer (readPtr, writePtr, endPtr,
                                         slice.xStride, slice.fill,
                                         slice.fillValue, _lineBuffer->format,
                                         slice.typeInFrameBuffer,
                                         slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}